

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O2

void __thiscall tlx::CmdlineParser::print_result(CmdlineParser *this,ostream *os)

{
  Argument *pAVar1;
  long lVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer ppAVar5;
  string typestr;
  allocator local_b9;
  CmdlineParser *local_b8;
  long local_b0;
  pointer local_a8;
  undefined4 local_9c;
  ulong local_98;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_98 = this->option_max_width_;
  if (this->option_max_width_ < this->param_max_width_) {
    local_98 = this->param_max_width_;
  }
  local_9c = *(undefined4 *)(os + *(long *)(*(long *)os + -0x18) + 0x18);
  local_b8 = this;
  if ((this->param_list_).
      super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->param_list_).
      super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    poVar4 = std::operator<<(os,"Parameters:");
    std::endl<char,std::char_traits<char>>(poVar4);
    ppAVar5 = (local_b8->param_list_).
              super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_b0 = (long)(int)local_98;
    while (ppAVar5 !=
           (local_b8->param_list_).
           super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
      pAVar1 = *ppAVar5;
      local_a8 = ppAVar5;
      poVar4 = std::operator<<(os,"  ");
      lVar2 = *(long *)poVar4;
      *(long *)(poVar4 + *(long *)(lVar2 + -0x18) + 0x10) = local_b0;
      lVar2 = *(long *)(lVar2 + -0x18);
      *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffff4f | 0x20;
      Argument::param_text_abi_cxx11_(&local_90,pAVar1);
      std::operator<<(poVar4,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      iVar3 = (*pAVar1->_vptr_Argument[2])(pAVar1);
      std::__cxx11::string::string
                ((string *)&local_70,(char *)CONCAT44(extraout_var,iVar3),&local_b9);
      std::operator+(&local_50,"(",&local_70);
      std::operator+(&local_90,&local_50,")");
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 0x14;
      std::operator<<(os,(string *)&local_90);
      (*pAVar1->_vptr_Argument[4])(pAVar1,os);
      std::endl<char,std::char_traits<char>>(os);
      std::__cxx11::string::~string((string *)&local_90);
      ppAVar5 = local_a8 + 1;
    }
  }
  if ((local_b8->option_list_).
      super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (local_b8->option_list_).
      super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    poVar4 = std::operator<<(os,"Options:");
    std::endl<char,std::char_traits<char>>(poVar4);
    local_a8 = (local_b8->option_list_).
               super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_b0 = (long)(int)local_98;
    for (; local_a8 !=
           (local_b8->option_list_).
           super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
           ._M_impl.super__Vector_impl_data._M_finish; local_a8 = local_a8 + 1) {
      pAVar1 = *local_a8;
      poVar4 = std::operator<<(os,"  ");
      lVar2 = *(long *)poVar4;
      *(long *)(poVar4 + *(long *)(lVar2 + -0x18) + 0x10) = local_b0;
      lVar2 = *(long *)(lVar2 + -0x18);
      *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffff4f | 0x20;
      Argument::option_text_abi_cxx11_(&local_90,pAVar1);
      std::operator<<(poVar4,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      iVar3 = (*pAVar1->_vptr_Argument[2])(pAVar1);
      std::__cxx11::string::string
                ((string *)&local_70,(char *)CONCAT44(extraout_var_00,iVar3),&local_b9);
      std::operator+(&local_50,"(",&local_70);
      std::operator+(&local_90,&local_50,")");
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      lVar2 = *(long *)os;
      *(undefined8 *)(os + *(long *)(lVar2 + -0x18) + 0x10) = 0x14;
      lVar2 = *(long *)(lVar2 + -0x18);
      *(uint *)(os + lVar2 + 0x18) = *(uint *)(os + lVar2 + 0x18) & 0xffffff4f | 0x20;
      std::operator<<(os,(string *)&local_90);
      (*pAVar1->_vptr_Argument[4])(pAVar1,os);
      std::endl<char,std::char_traits<char>>(os);
      std::__cxx11::string::~string((string *)&local_90);
    }
  }
  *(undefined4 *)(os + *(long *)(*(long *)os + -0x18) + 0x18) = local_9c;
  return;
}

Assistant:

void CmdlineParser::print_result(std::ostream& os) {
    std::ios::fmtflags flags(os.flags());

    size_t maxlong = std::max(param_max_width_, option_max_width_);

    if (!param_list_.empty()) {
        os << "Parameters:" << std::endl;

        for (ArgumentList::const_iterator it = param_list_.begin();
             it != param_list_.end(); ++it) {
            const Argument* arg = *it;

            os << "  " << std::setw(static_cast<int>(maxlong))
               << std::left << arg->param_text();

            std::string typestr = "(" + std::string(arg->type_name()) + ")";
            os << std::setw(max_type_name_ + 4) << typestr;

            arg->print_value(os);

            os << std::endl;
        }
    }

    if (!option_list_.empty()) {
        os << "Options:" << std::endl;

        for (ArgumentList::const_iterator it = option_list_.begin();
             it != option_list_.end(); ++it) {
            const Argument* arg = *it;

            os << "  " << std::setw(static_cast<int>(maxlong))
               << std::left << arg->option_text();

            std::string typestr = "(" + std::string(arg->type_name()) + ")";
            os << std::setw(max_type_name_ + 4) << std::left << typestr;

            arg->print_value(os);

            os << std::endl;
        }
    }

    os.flags(flags);
}